

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_all_local(REF_CELL ref_cell,REF_NODE ref_node,REF_INT cell,REF_BOOL *all_local_nodes)

{
  REF_INT *pRVar1;
  long lVar2;
  uint uVar3;
  
  *all_local_nodes = 1;
  if ((-1 < cell) && (cell < ref_cell->max)) {
    pRVar1 = ref_cell->c2n;
    if (pRVar1[(long)ref_cell->size_per * (long)cell] != -1) {
      uVar3 = 1;
      for (lVar2 = 0; (int)lVar2 < ref_cell->node_per; lVar2 = lVar2 + 1) {
        if (uVar3 == 0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (uint)(ref_node->ref_mpi->id ==
                        ref_node->part[pRVar1[(long)ref_cell->size_per * (long)cell + lVar2]]);
        }
        *all_local_nodes = uVar3;
      }
      return 0;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x3a0,
         "ref_cell_all_local","invalid cell");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_all_local(REF_CELL ref_cell, REF_NODE ref_node,
                                      REF_INT cell, REF_BOOL *all_local_nodes) {
  REF_INT cell_node;

  *all_local_nodes = REF_TRUE;
  RAS(ref_cell_valid(ref_cell, cell), "invalid cell");

  each_ref_cell_cell_node(ref_cell, cell_node) {
    *all_local_nodes =
        *all_local_nodes &&
        ref_node_owned(ref_node, ref_cell_c2n(ref_cell, cell_node, cell));
  }

  return REF_SUCCESS;
}